

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_call(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA **ppCVar1;
  short sVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  CClass *pCVar8;
  CHAR_DATA *pCVar9;
  char *pcVar10;
  CHAR_DATA *victim;
  ulong uVar11;
  string_view fmt;
  int sn;
  ulong local_3658;
  int local_364c;
  int local_3648;
  int where;
  CHAR_DATA *local_3640;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  
  bVar4 = is_npc(ch);
  if ((bVar4) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) {
    return;
  }
  target_name = one_argument(argument,arg1);
  one_argument(target_name,arg2);
  if (arg1[0] == '\0') {
    pcVar10 = "Call which what where?\n\r";
    goto LAB_0032b2bd;
  }
  uVar5 = find_spell(ch,arg1);
  sn = uVar5;
  if (((((int)uVar5 < 1) || (uVar11 = (ulong)uVar5, skill_table[uVar11].spell_fun == spell_null)) ||
      ((bVar4 = is_npc(ch), !bVar4 && (iVar6 = get_skill(ch,uVar5), iVar6 < 5)))) ||
     ((bVar4 = is_npc(ch), !bVar4 && (ch->pcdata->learned[uVar11] == 0)))) {
    pcVar10 = "You don\'t know any powers of that name.\n\r";
    goto LAB_0032b2bd;
  }
  if ((ch->position < skill_table[uVar11].minimum_position) && (iVar6 = get_trust(ch), iVar6 < 0x3b)
     ) {
    pcVar10 = "You can\'t concentrate enough.\n\r";
    goto LAB_0032b2bd;
  }
  if ((skill_table[uVar11].ctype != 3) && (bVar4 = is_immortal(ch), !bVar4)) {
    pcVar10 = "You can\'t call that.\n\r";
    goto LAB_0032b2bd;
  }
  bVar4 = cabal_down(ch,(int)ch->cabal);
  if (bVar4) {
    return;
  }
  sVar2 = ch->level;
  pCVar8 = char_data::Class(ch);
  iVar6 = CClass::GetIndex(pCVar8);
  if (sVar2 + 2 == (int)*(short *)(uVar11 * 0x60 + 0x4ab788 + (long)iVar6 * 2)) {
    local_3658 = CONCAT44(local_3658._4_4_,0x32);
  }
  else {
    sVar2 = skill_table[uVar11].min_mana;
    local_3658 = (ulong)(uint)(int)ch->level;
    pCVar8 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar8);
    iVar7 = (int)(100 / (long)(((int)local_3658 -
                               (int)*(short *)(uVar11 * 0x60 + 0x4ab788 + (long)iVar6 * 2)) + 2));
    iVar6 = (int)sVar2;
    if (sVar2 < iVar7) {
      iVar6 = iVar7;
    }
    local_3658 = CONCAT44(local_3658._4_4_,iVar6);
  }
  pCVar9 = ch;
  switch(skill_table[uVar11].target) {
  case 0:
    pCVar9 = (CHAR_DATA *)0x0;
    iVar6 = 3;
    goto LAB_0032b545;
  case 1:
  case 9:
    if (arg2[0] == '\0') {
      pCVar9 = ch->fighting;
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pcVar10 = "Call the power on whom?\n\r";
        goto LAB_0032b2bd;
      }
    }
    else {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 == (CHAR_DATA *)0x0) {
LAB_0032b5b8:
        pcVar10 = "They aren\'t here.\n\r";
        goto LAB_0032b2bd;
      }
    }
    bVar4 = is_affected_by(ch,0x12);
    if (bVar4) {
      bVar3 = 0;
      iVar6 = 0;
      victim = pCVar9;
      if (ch->master == pCVar9) {
        pcVar10 = "You can\'t do that on your own master.\n\r";
        goto LAB_0032b2bd;
      }
    }
    else {
LAB_0032b611:
      bVar3 = 0;
      iVar6 = 0;
      victim = pCVar9;
    }
    break;
  case 2:
    if (arg2[0] == '\0') {
      bVar3 = 0;
      iVar6 = 0;
      victim = ch;
    }
    else {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 == (CHAR_DATA *)0x0) goto LAB_0032b5b8;
LAB_0032b49a:
      bVar3 = 0;
      iVar6 = 0;
      victim = pCVar9;
    }
    break;
  case 3:
    if ((arg2[0] != '\0') && (bVar4 = is_name(target_name,ch->name), !bVar4)) {
      pcVar10 = "You cannot call this power on another.\n\r";
      goto LAB_0032b2bd;
    }
    goto LAB_0032b4cb;
  case 4:
    if (arg2[0] == '\0') {
      pcVar10 = "What should the power be called upon?\n\r";
      goto LAB_0032b2bd;
    }
    pCVar9 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
    if (pCVar9 == (CHAR_DATA *)0x0) {
      pcVar10 = "You are not carrying that.\n\r";
      goto LAB_0032b2bd;
    }
LAB_0032b543:
    iVar6 = 1;
LAB_0032b545:
    bVar3 = 1;
LAB_0032b546:
    victim = (CHAR_DATA *)0x0;
    break;
  case 5:
    if (arg2[0] != '\0') {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 != (CHAR_DATA *)0x0) goto LAB_0032b49a;
      pCVar9 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
LAB_0032b456:
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pcVar10 = "You don\'t see that here.\n\r";
        goto LAB_0032b2bd;
      }
      goto LAB_0032b543;
    }
LAB_0032b4cb:
    bVar3 = 0;
    iVar6 = 0;
    goto LAB_0032b546;
  case 6:
    if (arg2[0] == '\0') {
      pCVar9 = ch->fighting;
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pcVar10 = "Call the power on who or what?\n\r";
        goto LAB_0032b2bd;
      }
    }
    else {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pCVar9 = (CHAR_DATA *)get_obj_here(ch,target_name);
        goto LAB_0032b456;
      }
    }
    bVar4 = is_affected_by(ch,0x12);
    if (!bVar4) goto LAB_0032b611;
    bVar3 = 0;
    iVar6 = 0;
    victim = pCVar9;
    if (ch->master == pCVar9) {
      pcVar10 = "You can\'t do that on your own follower.\n\r";
      goto LAB_0032b2bd;
    }
    break;
  case 7:
    bVar3 = 1;
    where = direction_lookup(target_name);
    if ((where < 0) || (ch->in_room->exit[where] == (EXIT_DATA *)0x0)) {
      pcVar10 = "That\'s not a valid direction.\n\r";
      goto LAB_0032b2bd;
    }
    iVar6 = 5;
    pCVar9 = (CHAR_DATA *)&where;
    victim = (CHAR_DATA *)0x0;
    break;
  default:
    fmt._M_str = "Do_cast: bad target for sn {}.";
    fmt._M_len = 0x1e;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&sn);
    return;
  }
  local_3648 = iVar6;
  local_3640 = pCVar9;
  bVar4 = is_npc(ch);
  if ((!bVar4) && ((int)ch->mana < (int)(uint)local_3658)) {
    pcVar10 = "You don\'t have enough mana.\n\r";
LAB_0032b2bd:
    send_to_char(pcVar10,ch);
    return;
  }
  WAIT_STATE(ch,(int)skill_table[uVar11].beats);
  bVar4 = is_npc(ch);
  if (!bVar4) {
    local_364c = number_percent();
    iVar6 = get_skill(ch,uVar5);
    if (iVar6 < local_364c) {
      send_to_char("You lost your concentration.\n\r",ch);
      if (uVar5 != (int)gsn_rage) {
        check_improve(ch,uVar5,false,1);
      }
      ch->mana = ch->mana +
                 (short)((int)((uint)(ushort)((short)local_3658 >> 0xf) << 0x10 |
                              (uint)local_3658 & 0xffff) / -2);
      goto LAB_0032b7de;
    }
  }
  ch->mana = ch->mana - (short)local_3658;
  if (skill_table[uVar11].target == 1) {
    bVar4 = is_safe(ch,victim);
    if (bVar4) {
      return;
    }
    if ((((skill_table[sn].target == 1) && (bVar4 = is_npc(ch), !bVar4)) &&
        (bVar4 = is_npc(victim), !bVar4)) &&
       ((ch->fighting == (CHAR_DATA *)0x0 || (victim->fighting == (CHAR_DATA *)0x0)))) {
      uVar5 = number_range(0,2);
      if (uVar5 < 3) {
        iVar6 = *(int *)(&DAT_003ee500 + (ulong)uVar5 * 4);
        pcVar10 = pers(ch,victim);
        sprintf(buf,&DAT_003ee500 + iVar6,pcVar10);
      }
      if ((victim != ch) && (bVar4 = is_npc(ch), !bVar4)) {
        do_myell(victim,buf,ch);
      }
    }
  }
  (*skill_table[sn].spell_fun)(sn,(int)ch->level,ch,local_3640,local_3648);
  iVar6 = sn;
  check_improve(ch,sn,true,1);
  uVar11 = (ulong)iVar6;
LAB_0032b7de:
  if (victim == ch) {
    return;
  }
  if ((bool)(skill_table[uVar11].target != 1 & (bVar3 | skill_table[uVar11].target != 6))) {
    return;
  }
  if (victim->master == ch) {
    return;
  }
  un_blade_barrier(ch,(char *)0x0);
  pCVar9 = ch->in_room->people;
  do {
    if (pCVar9 == (CHAR_DATA *)0x0) {
      return;
    }
    ppCVar1 = &pCVar9->next_in_room;
    bVar4 = victim != pCVar9;
    pCVar9 = *ppCVar1;
  } while ((bVar4) || (victim->fighting != (CHAR_DATA *)0x0));
  multi_hit(victim,ch,-1);
  return;
}

Assistant:

void do_call(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	EXIT_DATA *pexit;
	void *vo;
	int mana, where;
	int sn;
	int target;

	if (is_npc(ch) && ch->desc == nullptr)
		return;

	target_name = one_argument(argument, arg1);

	one_argument(target_name, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Call which what where?\n\r", ch);
		return;
	}

	sn = find_spell(ch, arg1);

	if (sn < 1
		|| skill_table[sn].spell_fun == spell_null
		|| (!is_npc(ch) && get_skill(ch, sn) < 5)
		|| (!is_npc(ch) && ch->pcdata->learned[sn] == 0))
	{
		send_to_char("You don't know any powers of that name.\n\r", ch);
		return;
	}

	if (ch->position < skill_table[sn].minimum_position && get_trust(ch) < MAX_LEVEL - 1)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	if (skill_table[sn].ctype != CMD_POWER && !is_immortal(ch))
	{
		send_to_char("You can't call that.\n\r", ch);
		return;
	}

	if (cabal_down(ch, ch->cabal))
		return;

	if (ch->level + 2 == skill_table[sn].skill_level[ch->Class()->GetIndex()])
		mana = 50;
	else
		mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - skill_table[sn].skill_level[ch->Class()->GetIndex()]));

	/*
	 * Locate targets.
	 */
	victim = nullptr;
	obj = nullptr;
	vo = nullptr;
	target = TARGET_NONE;

	switch (skill_table[sn].target)
	{
		case TAR_IGNORE:
			break;
		case TAR_CHAR_GENERAL:
		case TAR_CHAR_OFFENSIVE:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on whom?\n\r", ch);
					return;
				}
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
			{
				send_to_char("You can't do that on your own master.\n\r", ch);
				return;
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_DEFENSIVE:
			if (arg2[0] == '\0')
				victim = ch;
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_SELF:
			if (arg2[0] != '\0' && !is_name(target_name, ch->name))
			{
				send_to_char("You cannot call this power on another.\n\r", ch);
				return;
			}

			vo = (void *)ch;
			target = TARGET_CHAR;
			break;
		case TAR_OBJ_INV:
			if (arg2[0] == '\0')
			{
				send_to_char("What should the power be called upon?\n\r", ch);
				return;
			}

			obj = get_obj_carry(ch, target_name, ch);

			if (obj == nullptr)
			{
				send_to_char("You are not carrying that.\n\r", ch);
				return;
			}

			vo = (void *)obj;
			target = TARGET_OBJ;
			break;
		case TAR_OBJ_CHAR_OFF:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on who or what?\n\r", ch);
					return;
				}

				target = TARGET_CHAR;
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim != nullptr)
					target = TARGET_CHAR;
			}

			if (target == TARGET_CHAR) /* check the sanity of the attack */
			{
				if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
				{
					send_to_char("You can't do that on your own follower.\n\r", ch);
					return;
				}

				vo = (void *)victim;
			}
			else if ((obj = get_obj_here(ch, target_name)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_OBJ_CHAR_DEF:
			if (arg2[0] == '\0')
			{
				vo = (void *)ch;
				target = TARGET_CHAR;
			}
			else if ((victim = get_char_room(ch, target_name)) != nullptr)
			{
				vo = (void *)victim;
				target = TARGET_CHAR;
			}
			else if ((obj = get_obj_carry(ch, target_name, ch)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_DIR:
			where = direction_lookup(target_name);
			pexit = ch->in_room->exit[where];

			if (where < 0 || !pexit)
			{
				send_to_char("That's not a valid direction.\n\r", ch);
				return;
			}

			vo = &where;
			target = TARGET_DIR;
			break;
		default:
			RS.Logger.Warn("Do_cast: bad target for sn {}.", sn);
			return;
	}

	if (!is_npc(ch) && ch->mana < mana)
	{
		send_to_char("You don't have enough mana.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[sn].beats);

	if (!is_npc(ch) && (number_percent() > get_skill(ch, sn)))
	{
		send_to_char("You lost your concentration.\n\r", ch);

		if (sn != gsn_rage)
			check_improve(ch, sn, false, 1);

		ch->mana -= mana / 2;
	}
	else
	{
		ch->mana -= mana;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE && is_safe(ch, victim))
			return;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
		{
			if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
			{
				switch (number_range(0, 2))
				{
					case 0:
					case 1:
						sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, victim));
						break;
					case 2:
						sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, victim));
						break;
				}

				if (victim != ch && !is_npc(ch))
					do_myell(victim, buf, ch);
			}

			if (check_volley(ch, victim))
			{
				act("$N reflects your spell right back at you!", ch, 0, victim, TO_CHAR);
				act("You reflect $n's spell right back at $m!", ch, 0, victim, TO_VICT);
				act("$N reflects $n's spell right back at $m!", ch, 0, victim, TO_NOTVICT);
				(*skill_table[sn].spell_fun)(sn, ch->level * 2, victim, ch, target);
				return;
			}
		}

		(*skill_table[sn].spell_fun)(sn, ch->level, ch, vo, target);
		check_improve(ch, sn, true, 1);
	}

	if ((skill_table[sn].target == TAR_CHAR_OFFENSIVE
			|| (skill_table[sn].target == TAR_OBJ_CHAR_OFF && target == TARGET_CHAR))
		&& victim != ch
		&& victim->master != ch)
	{
		CHAR_DATA *vch;
		CHAR_DATA *vch_next;
		un_blade_barrier(ch, nullptr);

		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;

			if (victim == vch && victim->fighting == nullptr)
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
				break;
			}
		}
	}
}